

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

size_t pstore::sparse_array<int,unsigned_long>::
       required_bytes<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (size_t count,
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 first,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       last)

{
  unsigned_long x;
  uint *puVar1;
  uint local_3c;
  unsigned_long *local_38;
  unsigned_long *local_30;
  uint local_28 [2];
  size_t sStack_20;
  uint elements;
  size_t count_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  last_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  first_local;
  
  local_38 = last._M_current;
  local_30 = first._M_current;
  sStack_20 = count;
  count_local = (size_t)last._M_current;
  last_local = first;
  x = bitmap<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                (first,last);
  local_28[0] = bit_count::pop_count(x);
  local_3c = 1;
  puVar1 = std::max<unsigned_int>(local_28,&local_3c);
  return (sStack_20 - 4) + (ulong)*puVar1 * 4;
}

Assistant:

static std::size_t required_bytes (std::size_t const count, InputIterator const first,
                                           InputIterator const last) {
            // There will always be sufficient storage for at least 1 instance of
            // ValueType (this comes from the built-in array).
            static_assert (sizeof (elements_) / sizeof (ValueType) == 1U,
                           "Expected elements_ to be an array of 1 ValueType");
            auto const elements = std::max (bit_count::pop_count (bitmap (first, last)), 1U);
            return count - sizeof (elements_) + elements * sizeof (ValueType);
        }